

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex)

{
  bool bVar1;
  StreamBlock *local_28;
  StreamBlock *pblock;
  size_t markerIndex_local;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_local;
  
  if ((markerIndex < this->pFirstBlock->Index) || (this->Pos < markerIndex)) {
    this_local._7_1_ = false;
  }
  else {
    if ((markerIndex < this->pThisBlock->Index) ||
       ((this->pThisBlock->Index + this->pThisBlock->Count <= markerIndex &&
        ((this->pThisBlock->Index + this->pThisBlock->Count != markerIndex ||
         (this->pThisBlock->Count == 0x200)))))) {
      local_28 = this->pFirstBlock;
      while( true ) {
        bVar1 = false;
        if (local_28->pNext != (StreamBlock *)0x0) {
          bVar1 = local_28->pNext->Index <= markerIndex;
        }
        if (!bVar1) break;
        local_28 = local_28->pNext;
      }
    }
    else {
      local_28 = this->pThisBlock;
    }
    pblock = (StreamBlock *)markerIndex;
    markerIndex_local = (size_t)this;
    std::
    map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
    ::
    insert_or_assign<SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*&>
              ((map<unsigned_long,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*>>>
                *)&this->Markers,(key_type_conflict *)&pblock,&local_28);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BacktrackingTokenStream<Token>::SetMarker(size_t markerIndex) {
    if (markerIndex < pFirstBlock->Index || markerIndex > Pos)
        return false;

    StreamBlock* pblock;

    // Find a block marker would belong to
    if (pThisBlock->Index <= markerIndex &&
        (pThisBlock->Index + pThisBlock->Count > markerIndex ||
         (pThisBlock->Index + pThisBlock->Count == markerIndex &&
          pThisBlock->Count != StreamBlock::BufferSize)))
        pblock = pThisBlock;
    else {
        pblock = pFirstBlock;
        while (pblock->pNext && pblock->pNext->Index <= markerIndex)
            pblock = pblock->pNext;
    }
    // Add marker
    Markers.insert_or_assign(markerIndex, pblock);
    return true;
}